

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steepestedgepricing.hpp
# Opt level: O2

void __thiscall
SteepestEdgePricing::update_weights
          (SteepestEdgePricing *this,QpVector *aq,QpVector *ep,HighsInt p,HighsInt q)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  pointer pdVar5;
  pointer pdVar6;
  HighsInt i;
  ulong uVar7;
  double dVar8;
  QpVector delta;
  
  uVar3 = (this->basis->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[p];
  Basis::ftran(&delta,this->basis,aq,false,-1);
  dVar8 = QpVector::dot(ep,ep);
  pdVar5 = (aq->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar5[(int)uVar3];
  pdVar6 = (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = (this->runtime->instance).num_var;
  for (uVar7 = 0; (long)uVar7 < (long)iVar4; uVar7 = uVar7 + 1) {
    if (uVar3 != uVar7) {
      dVar2 = pdVar5[uVar7];
      pdVar6[uVar7] =
           ((dVar2 * dVar2) / (dVar1 * dVar1)) * dVar8 +
           (dVar2 / dVar1) * -2.0 *
           delta.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7] + pdVar6[uVar7];
    }
  }
  pdVar6[(int)uVar3] = dVar8 / (dVar1 * dVar1);
  QpVector::~QpVector(&delta);
  return;
}

Assistant:

void update_weights(const QpVector& aq, const QpVector& ep, HighsInt p,
                      HighsInt q) {
    HighsInt rowindex_p = basis.getindexinfactor()[p];
    // printf("Update weights, p = %d, rowindex = %d, q = %d\n", p, rowindex_p,
    // q);

    // if (!check_weights()) {
    //   printf("weight check failed\n");
    //   exit(1);
    // }

    QpVector delta = basis.ftran(aq);

    // double old_weight_p_updated = weights[rowindex_p];
    //  exact weight coming in needs to come in before update.
    double old_weight_p_computed = ep.dot(ep);

    // if (fabs(old_weight_p_computed - old_weight_p_updated) >= 1e-2) {
    //   printf("old weight[p] discrepancy: updated = %lf, computed=%lf\n",
    //   old_weight_p_updated, old_weight_p_computed);
    // }

    double weight_p = old_weight_p_computed;

    double t_p = aq.value[rowindex_p];
    for (HighsInt i = 0; i < runtime.instance.num_var; i++) {
      if (i != rowindex_p) {
        double t_i = aq.value[i];
        weights[i] = weights[i] - 2 * (t_i / t_p) * delta.value[i] +
                     ((t_i * t_i) / (t_p * t_p)) * weight_p;
        // printf("weights[%d] = %lf\n", i, weights[i]);
      }
    }
    // QpVector new_ep = basis.btran(QpVector::unit(runtime.instance.num_var,
    // rowindex_p)); double computed_weight = new_ep.dot(new_ep);
    double new_weight_p_updated = weight_p / (t_p * t_p);

    // if (fabs(updated_weight - computed_weight) > 1e-4) {
    //   printf("updated weight %lf vs computed weight %lf. aq[p] = %lf\n",
    //   updated_weight, computed_weight, t_p); printf("old weight = %lf, aq[p]
    //   = %lf, ^2 = %lf, new weight = %lf\n", weight_p, t_p, t_p*t_p,
    //   updated_weight);
    // }
    weights[rowindex_p] = new_weight_p_updated;
  }